

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O3

int Abc_SuppFindVar(Vec_Wec_t *pS,Vec_Wec_t *pD,int nVars)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  
  if (nVars < 1) {
    iVar2 = -1;
  }
  else {
    uVar3 = 0;
    uVar1 = (ulong)(uint)pS->nSize;
    if (pS->nSize < 1) {
      uVar1 = uVar3;
    }
    iVar5 = -1;
    lVar4 = 4;
    iVar2 = -1;
    do {
      if (uVar1 == uVar3) goto LAB_0049c275;
      if (*(int *)((long)&pS->pArray->nCap + lVar4) == 0) {
        if (iVar2 != -1) {
          if ((long)pD->nSize <= (long)uVar3) goto LAB_0049c275;
          if (iVar5 <= *(int *)((long)&pD->pArray->nCap + lVar4)) goto LAB_0049c260;
        }
        if ((long)pD->nSize <= (long)uVar3) {
LAB_0049c275:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0xd3,"int Vec_WecLevelSize(Vec_Wec_t *, int)");
        }
        iVar5 = *(int *)((long)&pD->pArray->nCap + lVar4);
        iVar2 = (int)uVar3;
      }
LAB_0049c260:
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while ((uint)nVars != uVar3);
  }
  return iVar2;
}

Assistant:

int Abc_SuppFindVar( Vec_Wec_t * pS, Vec_Wec_t * pD, int nVars )
{
    int v, vBest = -1, dBest = -1;
    for ( v = 0; v < nVars; v++ )
    {
        if ( Vec_WecLevelSize(pS, v) )
            continue;
        if ( vBest == -1 || dBest > Vec_WecLevelSize(pD, v) )
            vBest = v, dBest = Vec_WecLevelSize(pD, v);
    }
    return vBest;
}